

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

void ZSTD_copyBlockSequences(ZSTD_CCtx *zc)

{
  seqDef *psVar1;
  BYTE *pBVar2;
  BYTE *pBVar3;
  ZSTD_Sequence *pZVar4;
  size_t sVar5;
  ZSTD_compressedBlockState_t *pZVar6;
  seqStore_t *psVar7;
  ulong uVar8;
  repcodes_t rVar9;
  undefined8 local_80;
  U32 local_78;
  uint local_60;
  U32 UStack_5c;
  U32 rawOffset;
  repcodes_t updatedRepcodes;
  size_t i;
  ZSTD_Sequence *outSeqs;
  size_t lastLLSize;
  size_t literalsRead;
  size_t seqStoreLiteralsSize;
  size_t seqStoreSeqSize;
  seqDef *seqStoreSeqs;
  seqStore_t *seqStore;
  ZSTD_CCtx *zc_local;
  
  psVar7 = ZSTD_getSeqStore(zc);
  psVar1 = psVar7->sequencesStart;
  uVar8 = (long)psVar7->sequences - (long)psVar1 >> 3;
  pBVar2 = psVar7->lit;
  pBVar3 = psVar7->litStart;
  lastLLSize = 0;
  pZVar4 = (zc->seqCollector).seqStart;
  sVar5 = (zc->seqCollector).seqIndex;
  pZVar6 = (zc->blockState).prevCBlock;
  _UStack_5c = *(undefined8 *)pZVar6->rep;
  updatedRepcodes.rep[0] = pZVar6->rep[2];
  updatedRepcodes.rep[1] = 0;
  updatedRepcodes.rep[2] = 0;
  for (; (ulong)updatedRepcodes.rep._4_8_ < uVar8;
      updatedRepcodes.rep._4_8_ = updatedRepcodes.rep._4_8_ + 1) {
    local_60 = psVar1[updatedRepcodes.rep._4_8_].offset - 3;
    pZVar4[sVar5 + updatedRepcodes.rep._4_8_].litLength =
         (uint)psVar1[updatedRepcodes.rep._4_8_].litLength;
    pZVar4[sVar5 + updatedRepcodes.rep._4_8_].matchLength =
         psVar1[updatedRepcodes.rep._4_8_].matchLength + 3;
    pZVar4[sVar5 + updatedRepcodes.rep._4_8_].rep = 0;
    if (updatedRepcodes.rep._4_8_ == (ulong)psVar7->longLengthPos) {
      if (psVar7->longLengthType == ZSTD_llt_literalLength) {
        pZVar4[sVar5 + updatedRepcodes.rep._4_8_].litLength =
             pZVar4[sVar5 + updatedRepcodes.rep._4_8_].litLength + 0x10000;
      }
      else if (psVar7->longLengthType == ZSTD_llt_matchLength) {
        pZVar4[sVar5 + updatedRepcodes.rep._4_8_].matchLength =
             pZVar4[sVar5 + updatedRepcodes.rep._4_8_].matchLength + 0x10000;
      }
    }
    if (psVar1[updatedRepcodes.rep._4_8_].offset < 4) {
      pZVar4[sVar5 + updatedRepcodes.rep._4_8_].rep = psVar1[updatedRepcodes.rep._4_8_].offset;
      if (pZVar4[sVar5 + updatedRepcodes.rep._4_8_].litLength == 0) {
        if (pZVar4[sVar5 + updatedRepcodes.rep._4_8_].rep == 3) {
          local_60 = UStack_5c - 1;
        }
        else {
          local_60 = *(uint *)((long)&stack0xffffffffffffffa4 +
                              (ulong)pZVar4[sVar5 + updatedRepcodes.rep._4_8_].rep * 4);
        }
      }
      else {
        local_60 = *(uint *)((long)&stack0xffffffffffffffa4 +
                            (ulong)(pZVar4[sVar5 + updatedRepcodes.rep._4_8_].rep - 1) * 4);
      }
    }
    pZVar4[sVar5 + updatedRepcodes.rep._4_8_].offset = local_60;
    rVar9 = ZSTD_updateRep(&stack0xffffffffffffffa4,psVar1[updatedRepcodes.rep._4_8_].offset - 1,
                           (uint)(psVar1[updatedRepcodes.rep._4_8_].litLength == 0));
    local_80 = rVar9.rep._0_8_;
    local_78 = rVar9.rep[2];
    _UStack_5c = local_80;
    updatedRepcodes.rep[0] = local_78;
    lastLLSize = pZVar4[sVar5 + updatedRepcodes.rep._4_8_].litLength + lastLLSize;
  }
  pZVar4[sVar5 + updatedRepcodes.rep._4_8_].litLength =
       ((int)pBVar2 - (int)pBVar3) - (int)lastLLSize;
  pZVar4[sVar5 + updatedRepcodes.rep._4_8_].rep = 0;
  pZVar4[sVar5 + updatedRepcodes.rep._4_8_].offset = 0;
  pZVar4[sVar5 + updatedRepcodes.rep._4_8_].matchLength = 0;
  (zc->seqCollector).seqIndex = uVar8 + 1 + (zc->seqCollector).seqIndex;
  return;
}

Assistant:

static void ZSTD_copyBlockSequences(ZSTD_CCtx* zc)
{
    const seqStore_t* seqStore = ZSTD_getSeqStore(zc);
    const seqDef* seqStoreSeqs = seqStore->sequencesStart;
    size_t seqStoreSeqSize = seqStore->sequences - seqStoreSeqs;
    size_t seqStoreLiteralsSize = (size_t)(seqStore->lit - seqStore->litStart);
    size_t literalsRead = 0;
    size_t lastLLSize;

    ZSTD_Sequence* outSeqs = &zc->seqCollector.seqStart[zc->seqCollector.seqIndex];
    size_t i;
    repcodes_t updatedRepcodes;

    assert(zc->seqCollector.seqIndex + 1 < zc->seqCollector.maxSequences);
    /* Ensure we have enough space for last literals "sequence" */
    assert(zc->seqCollector.maxSequences >= seqStoreSeqSize + 1);
    ZSTD_memcpy(updatedRepcodes.rep, zc->blockState.prevCBlock->rep, sizeof(repcodes_t));
    for (i = 0; i < seqStoreSeqSize; ++i) {
        U32 rawOffset = seqStoreSeqs[i].offset - ZSTD_REP_NUM;
        outSeqs[i].litLength = seqStoreSeqs[i].litLength;
        outSeqs[i].matchLength = seqStoreSeqs[i].matchLength + MINMATCH;
        outSeqs[i].rep = 0;

        if (i == seqStore->longLengthPos) {
            if (seqStore->longLengthType == ZSTD_llt_literalLength) {
                outSeqs[i].litLength += 0x10000;
            } else if (seqStore->longLengthType == ZSTD_llt_matchLength) {
                outSeqs[i].matchLength += 0x10000;
            }
        }

        if (seqStoreSeqs[i].offset <= ZSTD_REP_NUM) {
            /* Derive the correct offset corresponding to a repcode */
            outSeqs[i].rep = seqStoreSeqs[i].offset;
            if (outSeqs[i].litLength != 0) {
                rawOffset = updatedRepcodes.rep[outSeqs[i].rep - 1];
            } else {
                if (outSeqs[i].rep == 3) {
                    rawOffset = updatedRepcodes.rep[0] - 1;
                } else {
                    rawOffset = updatedRepcodes.rep[outSeqs[i].rep];
                }
            }
        }
        outSeqs[i].offset = rawOffset;
        /* seqStoreSeqs[i].offset == offCode+1, and ZSTD_updateRep() expects offCode
           so we provide seqStoreSeqs[i].offset - 1 */
        updatedRepcodes = ZSTD_updateRep(updatedRepcodes.rep,
                                         seqStoreSeqs[i].offset - 1,
                                         seqStoreSeqs[i].litLength == 0);
        literalsRead += outSeqs[i].litLength;
    }
    /* Insert last literals (if any exist) in the block as a sequence with ml == off == 0.
     * If there are no last literals, then we'll emit (of: 0, ml: 0, ll: 0), which is a marker
     * for the block boundary, according to the API.
     */
    assert(seqStoreLiteralsSize >= literalsRead);
    lastLLSize = seqStoreLiteralsSize - literalsRead;
    outSeqs[i].litLength = (U32)lastLLSize;
    outSeqs[i].matchLength = outSeqs[i].offset = outSeqs[i].rep = 0;
    seqStoreSeqSize++;
    zc->seqCollector.seqIndex += seqStoreSeqSize;
}